

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monomorphize.cpp
# Opt level: O3

void __thiscall wasm::anon_unknown_0::Monomorphize::run(Monomorphize *this,Module *module)

{
  __node_base_ptr *this_00;
  pointer *ppCVar1;
  pointer puVar2;
  pointer puVar3;
  tuple<wasm::Export_*,_std::default_delete<wasm::Export>_> tVar4;
  _Hash_node_base *p_Var5;
  Export *pEVar6;
  undefined1 auVar7 [16];
  void *pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  Expression ***pppEVar10;
  undefined4 uVar11;
  pointer ppEVar12;
  mapped_type mVar13;
  char cVar14;
  char cVar15;
  bool bVar16;
  Index IVar17;
  int *piVar18;
  ulong uVar19;
  _Hashtable<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  Function *pFVar20;
  mapped_type *pmVar21;
  Module *pMVar22;
  bool *pbVar23;
  __hash_code __c;
  __node_ptr p_Var24;
  Type *pTVar25;
  size_t sVar26;
  size_t sVar27;
  size_t sVar28;
  Type TVar29;
  Index *pIVar30;
  mapped_type *pmVar31;
  mapped_type *pmVar32;
  mapped_type *pmVar33;
  Expression *pEVar34;
  LocalSet *pLVar35;
  Builder BVar36;
  mapped_type *pmVar37;
  undefined8 uVar38;
  uint uVar39;
  pointer *ppuVar40;
  char *pcVar41;
  ulong uVar42;
  code *pcVar44;
  Expression **ppEVar45;
  Expression **extraout_RDX;
  __node_base_ptr *pp_Var46;
  pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext> *__k;
  Module *in_R9;
  int iVar47;
  _Head_base<0UL,_wasm::Export_*,_false> _Var48;
  char *pcVar49;
  iterator __begin2;
  pointer puVar50;
  long lVar51;
  undefined1 auVar52 [8];
  uint uVar53;
  iterator __end2;
  undefined1 auVar54 [8];
  _Head_base<0UL,_wasm::Function_*,_false> _Var55;
  bool bVar56;
  bool bVar57;
  Signature SVar58;
  Name NVar59;
  Name newTarget;
  Name newName;
  optional<wasm::Type> type;
  Name newTarget_00;
  undefined1 local_6e0 [8];
  ReturnCallersMap returnCallersMap;
  CallFinder callFinder;
  ShallowEffectAnalyzer currEffects;
  size_type __dnew;
  long local_448;
  char local_440 [152];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> vStack_380;
  Module *local_368;
  __uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> local_360;
  __uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> local_358;
  pointer local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_348;
  optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *local_340;
  pointer local_338;
  Expression ***local_330;
  size_t *psStack_328;
  unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
  immovable;
  __node_base_ptr local_2e8;
  long local_2e0;
  char local_2d8;
  void *local_2c8;
  long local_2c0;
  long local_2b8;
  size_t *local_2b0;
  bool *local_2a8;
  size_t *local_2a0;
  _Base_ptr local_298;
  size_t *local_290;
  bool *local_288;
  size_t *local_280;
  Expression *pEStack_278;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> newOperands;
  undefined1 auStack_258 [8];
  EffectAnalyzer nonMovingEffects;
  pointer *ppuStack_e8;
  vector<wasm::Name,_std::allocator<wasm::Name>_> funcNames;
  __uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> _Stack_c8;
  Name target;
  Type local_b0;
  Expression *curr;
  Builder builder;
  undefined1 auStack_88 [8];
  CallContext context;
  Builder local_60;
  Expression *child;
  __node_base local_50;
  Module *local_48;
  Module *local_40;
  _Head_base<0UL,_wasm::Function_*,_false> local_38;
  Type TVar43;
  
  callFinder.infos.
  super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&currEffects.super_EffectAnalyzer.module;
  currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0x18;
  child = (Expression *)this;
  local_48 = module;
  callFinder.infos.
  super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::__cxx11::string::_M_create
                          ((ulong *)&callFinder.infos.
                                     super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (ulong)&currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                                   super__Rb_tree_header._M_node_count);
  currEffects.super_EffectAnalyzer.module =
       (Module *)
       currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
       _M_node_count;
  (callFinder.infos.
   super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
   ._M_impl.super__Vector_impl_data._M_end_of_storage)->call = (Call *)0x70726f6d6f6e6f6d;
  (callFinder.infos.
   super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
   ._M_impl.super__Vector_impl_data._M_end_of_storage)->drop = (Expression **)0x6e696d2d657a6968;
  callFinder.infos.
  super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage[1].call = (Call *)0x746966656e65622d;
  currEffects.super_EffectAnalyzer.ignoreImplicitTraps =
       (bool)(undefined1)
             currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
             _M_node_count;
  currEffects.super_EffectAnalyzer.trapsNeverHappen =
       (bool)currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
             _M_node_count._1_1_;
  currEffects.super_EffectAnalyzer._2_6_ =
       currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
       _M_node_count._2_6_;
  *(undefined1 *)
   ((long)&(callFinder.infos.
            super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage)->call +
   currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
   ) = 0;
  uVar53 = wasm::(anonymous_namespace)::MinPercentBenefit;
  cVar15 = '\x01';
  if (9 < wasm::(anonymous_namespace)::MinPercentBenefit) {
    uVar39 = wasm::(anonymous_namespace)::MinPercentBenefit;
    cVar14 = '\x04';
    do {
      cVar15 = cVar14;
      if (uVar39 < 100) {
        cVar15 = cVar15 + -2;
        goto LAB_009800d2;
      }
      if (uVar39 < 1000) {
        cVar15 = cVar15 + -1;
        goto LAB_009800d2;
      }
      if (uVar39 < 10000) goto LAB_009800d2;
      bVar16 = 99999 < uVar39;
      uVar39 = uVar39 / 10000;
      cVar14 = cVar15 + '\x04';
    } while (bVar16);
    cVar15 = cVar15 + '\x01';
  }
LAB_009800d2:
  currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
       = (size_t)&local_448;
  std::__cxx11::string::_M_construct
            ((ulong)&currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                     super__Rb_tree_header._M_node_count,cVar15);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                     super__Rb_tree_header._M_node_count,(uint)__dnew,uVar53);
  Pass::getArgumentOrDefault
            ((string *)auStack_258,(Pass *)child,
             (string *)
             &callFinder.infos.
              super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (string *)
             &currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
              _M_node_count);
  auVar52 = auStack_258;
  piVar18 = __errno_location();
  iVar47 = *piVar18;
  *piVar18 = 0;
  uVar19 = strtoul((char *)auVar52,(char **)&returnCallersMap._M_h._M_single_bucket,10);
  if ((undefined1  [8])returnCallersMap._M_h._M_single_bucket == auVar52) {
    uVar38 = std::__throw_invalid_argument("stoul");
    if ((tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)local_38._M_head_impl !=
        (_Head_base<0UL,_wasm::Function_*,_false>)0x0) {
      std::default_delete<wasm::Function>::operator()
                ((default_delete<wasm::Function> *)&stack0xffffffffffffffc8,local_38._M_head_impl);
    }
    if (pEStack_278 != (Expression *)0x0) {
      operator_delete(pEStack_278,
                      (long)newOperands.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pEStack_278);
    }
    if (auStack_88 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_88,
                      (long)context.operands.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_88);
    }
    CallFinder::~CallFinder((CallFinder *)&returnCallersMap._M_h._M_single_bucket);
    if (ppuStack_e8 != (pointer *)0x0) {
      operator_delete(ppuStack_e8,
                      (long)funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppuStack_e8);
    }
    std::
    _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_bool>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_bool>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_6e0);
    _Unwind_Resume(uVar38);
  }
  if (*piVar18 == 0) {
    *piVar18 = iVar47;
  }
  else if (*piVar18 == 0x22) {
    std::__throw_out_of_range("stoul");
  }
  wasm::(anonymous_namespace)::MinPercentBenefit = (uint)uVar19;
  if (auStack_258 != (undefined1  [8])&nonMovingEffects.module) {
    operator_delete((void *)auStack_258,
                    (ulong)((long)&((nonMovingEffects.module)->exports).
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if ((long *)currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
              _M_node_count != &local_448) {
    operator_delete((void *)currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,local_448 + 1);
  }
  if (callFinder.infos.
      super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (pointer)&currEffects.super_EffectAnalyzer.module) {
    operator_delete(callFinder.infos.
                    super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (ulong)((long)&((currEffects.super_EffectAnalyzer.module)->exports).
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  pMVar22 = local_48;
  ReturnUtils::findReturnCallers
            ((unordered_map<wasm::Function_*,_bool,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>_>
              *)local_6e0,local_48);
  ppuStack_e8 = (pointer *)0x0;
  funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar50 = (pMVar22->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (pMVar22->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar50 != puVar2) {
    do {
      pFVar20 = (puVar50->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if ((pFVar20->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
        if (funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start ==
            funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                    ((vector<wasm::Name,std::allocator<wasm::Name>> *)&ppuStack_e8,
                     (iterator)
                     funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_start,(Name *)pFVar20);
        }
        else {
          pcVar41 = (pFVar20->super_Importable).super_Named.name.super_IString.str._M_str;
          ((funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_len =
               *(size_t *)&(pFVar20->super_Importable).super_Named;
          ((funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar41;
          funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start =
               funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
      }
      puVar50 = puVar50 + 1;
    } while (puVar50 != puVar2);
    local_338 = funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start;
    if ((pointer)ppuStack_e8 !=
        funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_330 = &callFinder.
                   super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                   .stack.fixed._M_elems[9].currp;
      local_348 = &local_3a8;
      local_298 = (_Base_ptr)&nonMovingEffects.globalsWritten;
      local_2b0 = &currEffects.super_EffectAnalyzer.breakTargets._M_t._M_impl.super__Rb_tree_header.
                   _M_node_count;
      local_2a8 = &currEffects.super_EffectAnalyzer.danglingPop;
      local_2a0 = &currEffects.super_EffectAnalyzer.mutableGlobalsRead._M_t._M_impl.
                   super__Rb_tree_header._M_node_count;
      local_280 = &nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_288 = &nonMovingEffects.danglingPop;
      local_290 = &nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                   _M_node_count;
      this_01 = (_Hashtable<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(child + 6);
      ppuVar40 = ppuStack_e8;
      TVar43.id = (uintptr_t)ppuStack_e8;
      do {
        local_360._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
        super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
             (tuple<wasm::Export_*,_std::default_delete<wasm::Export>_>)ppuVar40[1];
        local_340 = (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)ppuVar40;
        pFVar20 = Module::getFunction(local_48,(Name)*(string_view *)ppuVar40);
        pppEVar10 = local_330;
        this_00 = &returnCallersMap._M_h._M_single_bucket;
        returnCallersMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
        callFinder.
        super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
        .replacep = (Expression **)0x0;
        local_330[6] = (Expression **)0x0;
        pppEVar10[7] = (Expression **)0x0;
        pppEVar10[4] = (Expression **)0x0;
        pppEVar10[5] = (Expression **)0x0;
        pppEVar10[2] = (Expression **)0x0;
        pppEVar10[3] = (Expression **)0x0;
        *pppEVar10 = (Expression **)0x0;
        pppEVar10[1] = (Expression **)0x0;
        Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
        ::pushTask((Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                    *)this_00,
                   PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                   ::scan,&pFVar20->body);
        while (((long)callFinder.
                      super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                      .stack.flexible.
                      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start -
                (long)callFinder.
                      super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                      .stack.fixed._M_elems[9].currp >> 4) +
               (long)callFinder.
                     super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                     .replacep != 0) {
          if ((pointer)callFinder.
                       super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                       .
                       super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                       .stack.fixed._M_elems[9].currp ==
              callFinder.
              super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
              .stack.flexible.
              super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            if (callFinder.
                super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                .replacep == (Expression **)0x0) {
              pcVar41 = 
              "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::CallFinder, wasm::Visitor<wasm::(anonymous namespace)::CallFinder>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::CallFinder, wasm::Visitor<wasm::(anonymous namespace)::CallFinder>>::Task, N = 10]"
              ;
LAB_009817c8:
              __assert_fail("usedFixed > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                            ,0x7e,pcVar41);
            }
            ppEVar45 = callFinder.
                       super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                       .
                       super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                       .stack.fixed._M_elems
                       [(long)callFinder.
                              super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                              .
                              super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                              .replacep + -2].currp;
            returnCallersMap._M_h._M_single_bucket =
                 (__node_base_ptr)
                 callFinder.
                 super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                 .stack.fixed._M_elems
                 [(long)callFinder.
                        super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                        .replacep + -1].func;
            callFinder.
            super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            .replacep = (Expression **)
                        ((long)callFinder.
                               super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                               .
                               super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                               .replacep + -1);
          }
          else {
            ppEVar45 = (Expression **)
                       callFinder.
                       super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                       .
                       super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                       .stack.flexible.
                       super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
                       ._M_impl.super__Vector_impl_data._M_start[-1].func;
            returnCallersMap._M_h._M_single_bucket =
                 (__node_base_ptr)
                 callFinder.
                 super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                 .stack.flexible.
                 super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].currp;
            callFinder.
            super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            .stack.flexible.
            super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 callFinder.
                 super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                 .stack.flexible.
                 super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start + -1;
          }
          if ((Expression *)(returnCallersMap._M_h._M_single_bucket)->_M_nxt == (Expression *)0x0) {
            pcVar41 = 
            "void wasm::Walker<wasm::(anonymous namespace)::CallFinder, wasm::Visitor<wasm::(anonymous namespace)::CallFinder>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::CallFinder, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::CallFinder>]"
            ;
LAB_0098179d:
            __assert_fail("*task.currp",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                          ,0x132,pcVar41);
          }
          (*(code *)ppEVar45)((CallFinder *)this_00,
                              (Expression **)returnCallersMap._M_h._M_single_bucket);
        }
        local_368 = (Module *)
                    callFinder.infos.
                    super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        pMVar22 = callFinder.
                  super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                  .currModule;
        if (callFinder.
            super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            .currModule !=
            (Module *)
            callFinder.infos.
            super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          do {
            puVar3 = (pMVar22->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_50._M_nxt = (_Hash_node_base *)pMVar22;
            if (((_Head_base<0UL,_wasm::Export_*,_false>)
                 *(_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_> *)
                  &puVar3[1]._M_t.
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> !=
                 (Export *)0x1) &&
               (tVar4.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
                     *(_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_> *)
                      &puVar3[7]._M_t.
                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>,
               tVar4.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl !=
               (_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>)
               local_360._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)) {
              NVar59.super_IString.str._M_str =
                   (char *)tVar4.
                           super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                           .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
              NVar59.super_IString.str._M_len =
                   (size_t)puVar3[6]._M_t.
                           super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>;
              pFVar20 = Module::getFunction(local_48,NVar59);
              auStack_258 = (undefined1  [8])pFVar20;
              pmVar21 = std::__detail::
                        _Map_base<wasm::Function_*,_std::pair<wasm::Function_*const,_bool>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::Function_*,_std::pair<wasm::Function_*const,_bool>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)local_6e0,(key_type *)auStack_258);
              if (*pmVar21 == true) {
                local_50._M_nxt[1] = (_Hash_node_base *)0x0;
              }
              puVar3 = (((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          *)&(local_50._M_nxt)->_M_nxt)->
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              _Stack_c8._M_t.
              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
              super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
                   puVar3[6]._M_t.
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t;
              local_358._M_t.
              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
              super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
                   puVar3[7]._M_t.
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t;
              target.super_IString.str._M_len =
                   (size_t)local_358._M_t.
                           super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                           .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
              pMVar22 = (Module *)Module::getFunction(local_48,(IString)*(IString *)&puVar3[6]._M_t)
              ;
              pbVar9 = local_348;
              if ((pMVar22->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
                auStack_88 = (undefined1  [8])0x0;
                context.operands.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                context.operands.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                newOperands.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                pEStack_278 = (Expression *)0x0;
                newOperands.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     (child->type).id;
                curr = (Expression *)local_48;
                currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                _M_node_count = 0;
                __dnew = 0;
                local_350 = puVar3;
                local_40 = pMVar22;
                local_348[1].field_2._M_allocated_capacity = 0;
                *(undefined8 *)((long)&pbVar9[1].field_2 + 8) = 0;
                pbVar9[1]._M_dataplus._M_p = (pointer)0x0;
                pbVar9[1]._M_string_length = 0;
                (pbVar9->field_2)._M_allocated_capacity = 0;
                *(undefined8 *)((long)&pbVar9->field_2 + 8) = 0;
                (pbVar9->_M_dataplus)._M_p = (pointer)0x0;
                pbVar9->_M_string_length = 0;
                std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::reserve
                          (&vStack_380,0);
                puVar3 = (((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            *)&(local_50._M_nxt)->_M_nxt)->
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                tVar4.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
                     *(_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_> *)
                      &puVar3[3]._M_t.
                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>;
                if (tVar4.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                    .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl !=
                    (_Head_base<0UL,_wasm::Export_*,_false>)0x0) {
                  _Var48._M_head_impl = (Export *)0x0;
                  do {
                    if ((ulong)*(_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                 *)&puVar3[3]._M_t.
                                    super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                        <= _Var48._M_head_impl) goto LAB_009817d2;
                    auStack_258 = (undefined1  [8])
                                  *(size_t *)
                                   ((long)puVar3[2]._M_t.
                                          super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   + (long)_Var48._M_head_impl * 8);
                    if (((long)(local_3a8._M_string_length - (long)local_3a8._M_dataplus._M_p) >> 4)
                        + __dnew != 0) {
                      __assert_fail("stack.size() == 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                                    ,0x12d,
                                    "void wasm::Walker<Lister, wasm::UnifiedExpressionVisitor<Lister>>::walk(Expression *&) [SubType = Lister, VisitorType = wasm::UnifiedExpressionVisitor<Lister>]"
                                   );
                    }
                    Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::pushTask
                              ((Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_> *)
                               &currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                                super__Rb_tree_header._M_node_count,
                               PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::
                               scan,(Expression **)auStack_258);
                    while (((long)(local_3a8._M_string_length - (long)local_3a8._M_dataplus._M_p) >>
                           4) + __dnew != 0) {
                      if (local_3a8._M_dataplus._M_p == (pointer)local_3a8._M_string_length) {
                        if (__dnew == 0) {
                          pcVar41 = 
                          "T &wasm::SmallVector<wasm::Walker<Lister, wasm::UnifiedExpressionVisitor<Lister>>::Task, 10>::back() [T = wasm::Walker<Lister, wasm::UnifiedExpressionVisitor<Lister>>::Task, N = 10]"
                          ;
                          goto LAB_009817c8;
                        }
                        __dnew = __dnew - 1;
                        pcVar44 = *(code **)(local_440 + (__dnew * 2 + -1) * 8);
                        currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                        super__Rb_tree_header._M_node_count = *(size_t *)(local_440 + __dnew * 0x10)
                        ;
                      }
                      else {
                        pcVar44 = *(code **)(local_3a8._M_string_length + -0x10);
                        currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                        super__Rb_tree_header._M_node_count =
                             *(size_t *)(local_3a8._M_string_length + -8);
                        local_3a8._M_string_length = (size_type)(local_3a8._M_string_length + -0x10)
                        ;
                      }
                      if (*(long *)currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                                   super__Rb_tree_header._M_node_count == 0) {
                        pcVar41 = 
                        "void wasm::Walker<Lister, wasm::UnifiedExpressionVisitor<Lister>>::walk(Expression *&) [SubType = Lister, VisitorType = wasm::UnifiedExpressionVisitor<Lister>]"
                        ;
                        goto LAB_0098179d;
                      }
                      (*pcVar44)(&currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count);
                    }
                    _Var48._M_head_impl = _Var48._M_head_impl + 1;
                  } while ((_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>)
                           _Var48._M_head_impl !=
                           (_Head_base<0UL,_wasm::Export_*,_false>)
                           tVar4.
                           super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                           .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
                }
                psStack_328 = &immovable._M_h._M_rehash_policy._M_next_resize;
                immovable._M_h._M_buckets = (__buckets_ptr)0x1;
                immovable._M_h._M_bucket_count = 0;
                immovable._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                immovable._M_h._M_element_count._0_4_ = 0x3f800000;
                immovable._M_h._M_rehash_policy._M_max_load_factor = 0.0;
                immovable._M_h._M_rehash_policy._4_4_ = 0;
                immovable._M_h._M_rehash_policy._M_next_resize = 0;
                auStack_258._0_2_ =
                     *(undefined2 *)
                      (nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count + 0x50);
                nonMovingEffects._0_8_ = local_48;
                nonMovingEffects.module._0_6_ = CONCAT24(0,(local_48->features).features);
                nonMovingEffects.localsRead._M_t._M_impl._0_4_ = 0;
                nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                     _S_red;
                nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     (_Base_ptr)&nonMovingEffects.localsRead;
                nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     (_Base_ptr)0x0;
                nonMovingEffects.localsWritten._M_t._M_impl._0_4_ = 0;
                nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color
                     = _S_red;
                nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
                     0;
                nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent = (_Base_ptr)&nonMovingEffects.localsWritten;
                nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                     = (_Base_ptr)0x0;
                nonMovingEffects.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
                nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_color = _S_red;
                nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header.
                _4_4_ = 0;
                nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent = (_Base_ptr)&nonMovingEffects.mutableGlobalsRead;
                nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_right = (_Base_ptr)0x0;
                nonMovingEffects.globalsWritten._M_t._M_impl._0_4_ = 0;
                nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_color = _S_red;
                nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
                     0;
                nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent = local_298;
                nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                     = local_298;
                nonMovingEffects.breakTargets._M_t._M_impl._0_4_ = 0;
                nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color
                     = _S_red;
                nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0
                ;
                nonMovingEffects.readsMemory = false;
                nonMovingEffects.writesMemory = false;
                nonMovingEffects.readsTable = false;
                nonMovingEffects.writesTable = false;
                nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_right = (_Base_ptr)0x0;
                nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count = 0
                ;
                nonMovingEffects.trap = false;
                nonMovingEffects.implicitTrap = false;
                nonMovingEffects.isAtomic = false;
                nonMovingEffects.throws_ = false;
                nonMovingEffects._228_4_ = 0;
                nonMovingEffects.tryDepth._0_7_ = 0;
                nonMovingEffects._239_4_ = 0;
                nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                     = (_Base_ptr)&nonMovingEffects.breakTargets;
                nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                     = (_Base_ptr)0x0;
                nonMovingEffects.delegateTargets._M_t._M_impl._0_4_ = 0;
                nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_color = _S_red;
                nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
                     = 0;
                nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent = (_Base_ptr)&nonMovingEffects.delegateTargets;
                nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_right = (_Base_ptr)0x0;
                lVar51 = (long)vStack_380.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)vStack_380.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3;
                nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
                nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                     = nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_parent;
                nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left = nonMovingEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                          _M_header._M_parent;
                nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     nonMovingEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
                nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left = nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                          _M_header._M_parent;
                if (0 < lVar51) {
                  nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
                       = nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                         _M_node_count + 0x30;
                  do {
                    local_b0.id = (uintptr_t)
                                  vStack_380.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar51 + -1];
                    TVar43.id = (uintptr_t)immovable._M_h._M_buckets;
                    if ((long *)psStack_328[local_b0.id % (ulong)immovable._M_h._M_buckets] !=
                        (long *)0x0) {
                      in_R9 = *(Module **)
                               psStack_328[local_b0.id % (ulong)immovable._M_h._M_buckets];
                      pEVar34 = (Expression *)
                                (in_R9->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      do {
                        if ((Expression *)local_b0.id == pEVar34) goto LAB_009808b1;
                        in_R9 = (Module *)
                                (in_R9->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      } while ((in_R9 != (Module *)0x0) &&
                              (pEVar34 = (Expression *)
                                         (in_R9->exports).
                                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,
                              (ulong)pEVar34 % (ulong)immovable._M_h._M_buckets ==
                              local_b0.id % (ulong)immovable._M_h._M_buckets));
                    }
                    ppCVar1 = &callFinder.infos.
                               super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    ShallowEffectAnalyzer::ShallowEffectAnalyzer
                              ((ShallowEffectAnalyzer *)ppCVar1,
                               (PassOptions *)
                               nonMovingEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count,local_48,(Expression *)local_b0.id);
                    bVar16 = EffectAnalyzer::invalidates
                                       ((EffectAnalyzer *)ppCVar1,(EffectAnalyzer *)auStack_258);
                    if (((bVar16) ||
                        ((((currEffects.super_EffectAnalyzer.module._4_1_ != '\0' ||
                           (currEffects.super_EffectAnalyzer.breakTargets._M_t._M_impl.
                            super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0)) ||
                          ((long)&(currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                                   super__Rb_tree_header._M_header._M_right)->_M_color +
                           (long)currEffects.super_EffectAnalyzer.localsWritten._M_t._M_impl.
                                 super__Rb_tree_header._M_header._M_right != 0)) ||
                         (currEffects.super_EffectAnalyzer.module._5_1_ != '\0')))) ||
                       (((ulong)*(byte *)local_b0.id < 0x36 &&
                        ((0x3000000000000eU >> ((ulong)*(byte *)local_b0.id & 0x3f) & 1) != 0)))) {
LAB_00980845:
                      immovable._M_h._M_single_bucket = (__node_base_ptr)&psStack_328;
                      std::
                      _Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      ::
                      _M_insert<wasm::Expression*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Expression*,false>>>>
                                ((_Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                  *)&psStack_328,&local_b0,&immovable._M_h._M_single_bucket);
                      std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)local_2b0);
                      std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)local_2a8);
                      std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)local_2a0);
                      std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)&currEffects.super_EffectAnalyzer.localsWritten._M_t._M_impl.
                                      super__Rb_tree_header._M_node_count);
                      std::
                      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)&currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                                      super__Rb_tree_header._M_node_count);
                      std::
                      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)&currEffects.super_EffectAnalyzer.features);
LAB_009808b1:
                      EffectAnalyzer::visit((EffectAnalyzer *)auStack_258,(Expression *)local_b0.id)
                      ;
                      AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                                ((AbstractChildIterator<wasm::ChildIterator> *)
                                 &callFinder.infos.
                                  super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (Expression *)local_b0.id);
                      uVar53 = (int)((ulong)((long)currEffects.super_EffectAnalyzer.localsRead._M_t.
                                                   _M_impl.super__Rb_tree_header._M_header._M_parent
                                            - currEffects.super_EffectAnalyzer.localsRead._M_t.
                                              _M_impl.super__Rb_tree_header._M_header._0_8_) >> 3) +
                               (int)callFinder.infos.
                                    super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      if (uVar53 != 0) {
                        iVar47 = -1;
                        uVar19 = 0;
                        do {
                          uVar42 = (long)&(callFinder.infos.
                                           super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->call
                                   + ((long)currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl
                                            .super__Rb_tree_header._M_header._M_parent -
                                      currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                                      super__Rb_tree_header._M_header._0_8_ >> 3);
                          if (uVar42 <= uVar19) {
LAB_00981769:
                            __assert_fail("index < children.size()",
                                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/iteration.h"
                                          ,0x4a,
                                          "Index wasm::AbstractChildIterator<wasm::ChildIterator>::mapIndex(Index) const [Specific = wasm::ChildIterator]"
                                         );
                          }
                          uVar39 = (int)uVar42 + iVar47;
                          pbVar23 = (bool *)(currEffects.super_EffectAnalyzer.localsRead._M_t.
                                             _M_impl.super__Rb_tree_header._M_header._0_8_ + -0x20 +
                                            (ulong)uVar39 * 8);
                          if ((uVar39 & 0xfffffffc) == 0) {
                            pbVar23 = &currEffects.super_EffectAnalyzer.ignoreImplicitTraps +
                                      (ulong)uVar39 * 8;
                          }
                          local_60.wasm = (Module *)**(size_t **)pbVar23;
                          immovable._M_h._M_single_bucket = (__node_base_ptr)&psStack_328;
                          std::
                          _Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          ::
                          _M_insert<wasm::Expression*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Expression*,false>>>>
                                    ((_Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                      *)&psStack_328,&local_60,&immovable._M_h._M_single_bucket);
                          uVar19 = uVar19 + 1;
                          iVar47 = iVar47 + -1;
                        } while (uVar53 != uVar19);
                      }
                      if (currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                          super__Rb_tree_header._M_header._0_8_ != 0) {
                        operator_delete((void *)currEffects.super_EffectAnalyzer.localsRead._M_t.
                                                _M_impl.super__Rb_tree_header._M_header._0_8_,
                                        (long)currEffects.super_EffectAnalyzer.localsRead._M_t.
                                              _M_impl.super__Rb_tree_header._M_header._M_left -
                                        currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                                        super__Rb_tree_header._M_header._0_8_);
                      }
                    }
                    else {
                      AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                                ((AbstractChildIterator<wasm::ChildIterator> *)
                                 &immovable._M_h._M_single_bucket,(Expression *)local_b0.id);
                      uVar53 = (int)immovable._M_h._M_single_bucket +
                               (int)((ulong)(local_2c0 - (long)local_2c8) >> 3);
                      uVar19 = (ulong)uVar53;
                      if (uVar53 == 0) {
                        bVar16 = true;
                      }
                      else {
                        uVar42 = (long)&(immovable._M_h._M_single_bucket)->_M_nxt +
                                 (local_2c0 - (long)local_2c8 >> 3);
                        do {
                          uVar42 = uVar42 - 1;
                          uVar19 = uVar19 - 1;
                          if (uVar42 == 0xffffffffffffffff) goto LAB_00981769;
                          pp_Var46 = (__node_base_ptr *)((long)local_2c8 + -0x20);
                          if ((uVar42 & 0xfffffffc) == 0) {
                            pp_Var46 = &local_2e8;
                          }
                          p_Var5 = pp_Var46[uVar42 & 0xffffffff]->_M_nxt[1]._M_nxt;
                          bVar56 = p_Var5 < (_Hash_node_base *)0x7;
                          TVar43.id = CONCAT71((int7)((uVar42 & 0xffffffff) >> 8),bVar56);
                          bVar57 = ((ulong)p_Var5 & 1) == 0;
                          bVar16 = bVar57 || bVar56;
                        } while ((bVar57 || bVar56) && (uVar19 != 0));
                      }
                      if (local_2c8 != (void *)0x0) {
                        operator_delete(local_2c8,local_2b8 - (long)local_2c8);
                      }
                      if (!bVar16) goto LAB_00980845;
                      std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)local_2b0);
                      std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)local_2a8);
                      std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)local_2a0);
                      std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                   *)&currEffects.super_EffectAnalyzer.localsWritten._M_t._M_impl.
                                      super__Rb_tree_header._M_node_count);
                      std::
                      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)&currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                                      super__Rb_tree_header._M_node_count);
                      std::
                      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)&currEffects.super_EffectAnalyzer.features);
                    }
                    bVar16 = 1 < lVar51;
                    lVar51 = lVar51 + -1;
                  } while (bVar16);
                }
                puVar3 = (((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            *)&(local_50._M_nxt)->_M_nxt)->
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                tVar4.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
                     *(_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_> *)
                      &puVar3[3]._M_t.
                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>;
                if (tVar4.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                    .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl !=
                    (_Head_base<0UL,_wasm::Export_*,_false>)0x0) {
                  _Var48._M_head_impl = (Export *)0x0;
                  do {
                    if ((ulong)*(_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                 *)&puVar3[3]._M_t.
                                    super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                        <= _Var48._M_head_impl) {
LAB_009817d2:
                      __assert_fail("index < usedElements",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                                    ,0xbc,
                                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                                   );
                    }
                    pEVar34 = *(Expression **)
                               ((long)puVar3[2]._M_t.
                                      super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                               + (long)_Var48._M_head_impl * 8);
                    callFinder.infos.
                    super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    currEffects.super_EffectAnalyzer.ignoreImplicitTraps = false;
                    currEffects.super_EffectAnalyzer.trapsNeverHappen = false;
                    currEffects.super_EffectAnalyzer._2_6_ = 0;
                    currEffects.super_EffectAnalyzer.module = (Module *)0x0;
                    currEffects.super_EffectAnalyzer.features.features = 0;
                    currEffects.super_EffectAnalyzer.branchesOut = false;
                    currEffects.super_EffectAnalyzer.calls = false;
                    currEffects.super_EffectAnalyzer._22_2_ = 0;
                    callFinder.infos.
                    super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)operator_new(0x18)
                    ;
                    (callFinder.infos.
                     super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->call =
                         (Call *)&psStack_328;
                    (callFinder.infos.
                     super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->drop = &pEStack_278;
                    callFinder.infos.
                    super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage[1].call = (Call *)&curr;
                    currEffects.super_EffectAnalyzer._16_8_ =
                         std::
                         _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Monomorphize.cpp:429:24)>
                         ::_M_invoke;
                    currEffects.super_EffectAnalyzer.module =
                         (Module *)
                         std::
                         _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Monomorphize.cpp:429:24)>
                         ::_M_manager;
                    immovable._M_h._M_single_bucket =
                         (__node_base_ptr)
                         ExpressionManipulator::flexibleCopy
                                   (pEVar34,local_48,
                                    (CustomCopier *)
                                    &callFinder.infos.
                                     super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                    emplace_back<wasm::Expression*>
                              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                               auStack_88,(Expression **)&immovable._M_h._M_single_bucket);
                    if (currEffects.super_EffectAnalyzer.module != (Module *)0x0) {
                      ppCVar1 = &callFinder.infos.
                                 super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      (*(code *)currEffects.super_EffectAnalyzer.module)(ppCVar1,ppCVar1,3);
                    }
                    _Var48._M_head_impl = _Var48._M_head_impl + 1;
                  } while (tVar4.
                           super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                           .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl !=
                           (_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>)
                           _Var48._M_head_impl);
                }
                context.operands.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_1_ =
                     *(pointer *)(local_50._M_nxt + 1) != (pointer)0x0;
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)local_280);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)local_288);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)local_290);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)&nonMovingEffects.localsWritten._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&nonMovingEffects.features);
                std::
                _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::~_Hashtable((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               *)&psStack_328);
                if (vStack_380.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(vStack_380.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)vStack_380.
                                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)vStack_380.
                                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                puVar3 = local_350;
                if (local_3a8._M_dataplus._M_p != (pointer)0x0) {
                  operator_delete(local_3a8._M_dataplus._M_p,
                                  local_3a8.field_2._M_allocated_capacity -
                                  (long)local_3a8._M_dataplus._M_p);
                }
                nonMovingEffects.ignoreImplicitTraps =
                     (bool)(undefined1)target.super_IString.str._M_len;
                nonMovingEffects.trapsNeverHappen = (bool)target.super_IString.str._M_len._1_1_;
                nonMovingEffects._2_6_ = target.super_IString.str._M_len._2_6_;
                auStack_258 = (undefined1  [8])
                              _Stack_c8._M_t.
                              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                              .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
                __k = (pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext> *)auStack_88;
                std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                          ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           &nonMovingEffects.module,
                           (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)__k);
                nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color.
                _0_1_ = (char)context.operands.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                __c = std::__detail::
                      _Hash_code_base<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_std::__detail::_Select1st,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                      ::_M_hash_code((_Hash_code_base<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_std::__detail::_Select1st,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                                      *)auStack_258,__k);
                p_Var24 = std::
                          _Hashtable<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          ::_M_find_node(this_01,__c % child[6].type.id,(key_type *)auStack_258,__c)
                ;
                if (nonMovingEffects.module != (Module *)0x0) {
                  operator_delete(nonMovingEffects.module,
                                  CONCAT44(nonMovingEffects.localsRead._M_t._M_impl._4_4_,
                                           nonMovingEffects.localsRead._M_t._M_impl._0_4_) -
                                  (long)nonMovingEffects.module);
                }
                if (p_Var24 == (__node_ptr)0x0) {
                  if ((char)context.operands.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
                    if ((_Head_base<0UL,_wasm::Export_*,_false>)
                        ((long)context.operands.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)auStack_88 >> 3) !=
                        (_Head_base<0UL,_wasm::Export_*,_false>)
                        *(_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_> *)
                         &puVar3[3]._M_t.
                          super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>) {
                      __assert_fail("operands.size() == call->operands.size()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Monomorphize.cpp"
                                    ,0x202,
                                    "bool wasm::(anonymous namespace)::CallContext::isTrivial(Call *, Module &)"
                                   );
                    }
                    pFVar20 = Module::getFunction(local_48,(IString)*(IString *)(puVar3 + 6));
                    SVar58 = HeapType::getSignature(&pFVar20->type);
                    callFinder.infos.
                    super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)SVar58.params.id;
                    if ((undefined1  [8])
                        context.operands.
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_start == auStack_88) {
LAB_009813dd:
                      nonMovingEffects.ignoreImplicitTraps =
                           (bool)(undefined1)target.super_IString.str._M_len;
                      nonMovingEffects.trapsNeverHappen =
                           (bool)target.super_IString.str._M_len._1_1_;
                      nonMovingEffects._2_6_ = target.super_IString.str._M_len._2_6_;
                      auStack_258 = (undefined1  [8])
                                    _Stack_c8._M_t.
                                    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                    .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
                      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 &nonMovingEffects.module,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 auStack_88);
                      nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_color._0_1_ =
                           (char)context.operands.
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      pmVar37 = std::
                                unordered_map<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::equal_to<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>_>
                                ::operator[]((unordered_map<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::equal_to<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>_>
                                              *)this_01,(key_type *)auStack_258);
                      (pmVar37->super_IString).str._M_len =
                           (size_t)_Stack_c8._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
                      (pmVar37->super_IString).str._M_str = (char *)target.super_IString.str._M_len;
                      if (nonMovingEffects.module != (Module *)0x0) {
                        operator_delete(nonMovingEffects.module,
                                        CONCAT44(nonMovingEffects.localsRead._M_t._M_impl._4_4_,
                                                 nonMovingEffects.localsRead._M_t._M_impl._0_4_) -
                                        (long)nonMovingEffects.module);
                      }
                      goto LAB_0098168f;
                    }
                    pEVar34 = *(Expression **)auStack_88;
                    if (pEVar34->_id == LocalGetId) {
                      pcVar41 = (char *)0x0;
                      pcVar49 = (char *)0x1;
                      do {
                        nonMovingEffects._0_8_ = pcVar41;
                        auStack_258 = (undefined1  [8])
                                      &callFinder.infos.
                                       super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        pTVar25 = wasm::Type::Iterator::operator*((Iterator *)auStack_258);
                        if ((pEVar34->type).id != pTVar25->id) break;
                        if ((char *)((long)context.operands.
                                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start -
                                     (long)auStack_88 >> 3) <= pcVar49) goto LAB_009813dd;
                        pEVar34 = *(pointer)((long)auStack_88 + pcVar49 * 8);
                        pcVar41 = pcVar49;
                        pcVar49 = (char *)(ulong)((int)pcVar49 + 1);
                      } while (pEVar34->_id == LocalGetId);
                    }
                  }
                  ppEVar12 = context.operands.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  auVar52 = auStack_88;
                  sVar26 = Function::getNumParams((Function *)local_40);
                  pMVar22 = local_40;
                  if ((long)ppEVar12 - (long)auVar52 >> 3 != sVar26) {
                    __assert_fail("context.operands.size() == func->getNumParams()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Monomorphize.cpp"
                                  ,0x301,
                                  "std::unique_ptr<Function> wasm::(anonymous namespace)::Monomorphize::makeMonoFunctionWithContext(Function *, const CallContext &, Module &)"
                                 );
                  }
                  NVar59 = Names::getValidFunctionName
                                     (local_48,(IString)*(IString *)
                                                         &(local_40->exports).
                                                                                                                    
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data);
                  TVar43.id = NVar59.super_IString.str._M_str;
                  local_440[0] = '\0';
                  local_2d8 = '\0';
                  in_R9 = (Module *)
                          &currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                           super__Rb_tree_header._M_node_count;
                  newName.super_IString.str._M_str = NVar59.super_IString.str._M_len;
                  newName.super_IString.str._M_len = (size_t)local_48;
                  wasm::ModuleUtils::copyFunctionWithoutAdd
                            ((Function *)&stack0xffffffffffffffc8,pMVar22,newName,
                             (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                             TVar43.id,
                             (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                             in_R9);
                  if ((local_2d8 == '\x01') &&
                     (local_2d8 = '\0', immovable._M_h._M_single_bucket != (__node_base_ptr)0x0)) {
                    operator_delete(immovable._M_h._M_single_bucket,
                                    local_2e0 - (long)immovable._M_h._M_single_bucket);
                  }
                  if ((local_440[0] == '\x01') &&
                     (local_440[0] = '\0',
                     currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                     super__Rb_tree_header._M_node_count != 0)) {
                    operator_delete((void *)currEffects.super_EffectAnalyzer.delegateTargets._M_t.
                                            _M_impl.super__Rb_tree_header._M_node_count,
                                    local_448 -
                                    currEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                                    super__Rb_tree_header._M_node_count);
                  }
                  ppEVar12 = context.operands.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  psStack_328 = (size_t *)0x0;
                  immovable._M_h._M_buckets = (__buckets_ptr)0x0;
                  immovable._M_h._M_bucket_count = 0;
                  for (auVar52 = auStack_88; auVar52 != (undefined1  [8])ppEVar12;
                      auVar52 = (undefined1  [8])((long)auVar52 + 8)) {
                    FindAll<wasm::LocalGet>::FindAll
                              ((FindAll<wasm::LocalGet> *)auStack_258,*(Expression **)auVar52);
                    uVar38 = nonMovingEffects._0_8_;
                    auVar54 = auStack_258;
                    if (auStack_258 != (undefined1  [8])nonMovingEffects._0_8_) {
                      do {
                        if (immovable._M_h._M_buckets ==
                            (__buckets_ptr)immovable._M_h._M_bucket_count) {
                          std::vector<wasm::Type,std::allocator<wasm::Type>>::
                          _M_realloc_insert<wasm::Type_const&>
                                    ((vector<wasm::Type,std::allocator<wasm::Type>> *)&psStack_328,
                                     (iterator)immovable._M_h._M_buckets,
                                     (Type *)(*(long *)auVar54 + 8));
                        }
                        else {
                          *immovable._M_h._M_buckets =
                               (__node_base_ptr)((Type *)(*(long *)auVar54 + 8))->id;
                          immovable._M_h._M_buckets = immovable._M_h._M_buckets + 1;
                        }
                        auVar54 = (undefined1  [8])((long)auVar54 + 8);
                      } while (auVar54 != (undefined1  [8])uVar38);
                    }
                    if (auStack_258 != (undefined1  [8])0x0) {
                      operator_delete((void *)auStack_258,
                                      (long)nonMovingEffects.module - (long)auStack_258);
                    }
                  }
                  if ((char)context.operands.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
                    SVar58 = HeapType::getSignature
                                       ((HeapType *)
                                        &(local_40->globals).
                                         super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish);
                    TVar29 = SVar58.results.id;
                  }
                  else {
                    TVar29.id = 0;
                  }
                  wasm::Type::Type(&local_b0,(Tuple *)&psStack_328);
                  SVar58.results.id = TVar29.id;
                  SVar58.params.id = local_b0.id;
                  HeapType::HeapType((HeapType *)auStack_258,SVar58);
                  ((HeapType *)((long)local_38._M_head_impl + 0x38))->id = (uintptr_t)auStack_258;
                  callFinder.infos.
                  super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)&currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.
                                 super__Rb_tree_header._M_header._M_parent;
                  currEffects.super_EffectAnalyzer.ignoreImplicitTraps = true;
                  currEffects.super_EffectAnalyzer.trapsNeverHappen = false;
                  currEffects.super_EffectAnalyzer._2_6_ = 0;
                  currEffects.super_EffectAnalyzer.module = (Module *)0x0;
                  currEffects.super_EffectAnalyzer.features.features = 0;
                  currEffects.super_EffectAnalyzer.branchesOut = false;
                  currEffects.super_EffectAnalyzer.calls = false;
                  currEffects.super_EffectAnalyzer._22_2_ = 0;
                  currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl._0_4_ = 0x3f800000;
                  currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_color = _S_red;
                  currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.super__Rb_tree_header.
                  _M_header._4_4_ = 0;
                  currEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_parent = (_Base_ptr)0x0;
                  SVar58 = HeapType::getSignature((HeapType *)((long)local_38._M_head_impl + 0x38));
                  auStack_258 = (undefined1  [8])SVar58.params.id.id;
                  sVar26 = wasm::Type::size((Type *)auStack_258);
                  SVar58 = HeapType::getSignature
                                     ((HeapType *)
                                      &(local_40->globals).
                                       super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
                  curr = (Expression *)SVar58.params.id;
                  sVar27 = wasm::Type::size((Type *)&curr);
                  uVar53 = 0;
                  while( true ) {
                    auStack_258._0_4_ = uVar53;
                    sVar28 = Function::getNumLocals((Function *)local_40);
                    if (sVar28 <= uVar53) break;
                    bVar16 = Function::isParam((Function *)local_40,auStack_258._0_4_);
                    _Var55._M_head_impl = local_38._M_head_impl;
                    uVar11 = auStack_258._0_4_;
                    if (bVar16) {
                      TVar29 = Function::getLocalType((Function *)local_40,auStack_258._0_4_);
                      auVar7._8_8_ = 0;
                      auVar7._0_8_ = TVar29.id;
                      IVar17 = Builder::addVar((Builder *)_Var55._M_head_impl,(Function *)0x0,
                                               (Name)(auVar7 << 0x40),TVar43);
                      pIVar30 = std::__detail::
                                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                              *)&callFinder.infos.
                                                 super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                             (key_type *)auStack_258);
                    }
                    else {
                      pIVar30 = std::__detail::
                                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                              *)&callFinder.infos.
                                                 super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                             (key_type *)auStack_258);
                      IVar17 = uVar11 + ((int)sVar26 - (int)sVar27);
                    }
                    *pIVar30 = IVar17;
                    uVar53 = auStack_258._0_4_ + 1;
                  }
                  if ((local_40->memories).
                      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                    std::
                    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::clear(&((local_38._M_head_impl)->localNames)._M_h);
                    std::
                    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::clear((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)((long)local_38._M_head_impl + 0xa0));
                    uVar53 = 0;
                    while( true ) {
                      curr = (Expression *)CONCAT44(curr._4_4_,uVar53);
                      sVar26 = Function::getNumLocals((Function *)local_40);
                      if (sVar26 <= uVar53) break;
                      NVar59 = Function::getLocalNameOrDefault((Function *)local_40,(Index)curr);
                      if (NVar59.super_IString.str._M_str != (char *)0x0) {
                        pmVar31 = std::__detail::
                                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                *)&callFinder.infos.
                                                                                                      
                                                  super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               ,(key_type *)&curr);
                        local_60.wasm._0_4_ = *pmVar31;
                        _auStack_258 = (_Any_data)
                                       Names::getValidLocalName(local_38._M_head_impl,NVar59);
                        pmVar32 = std::__detail::
                                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                *)((long)local_38._M_head_impl + 0x68),
                                               (key_type *)&local_60);
                        (pmVar32->super_IString).str._M_len = (size_t)auStack_258;
                        (pmVar32->super_IString).str._M_str = (char *)nonMovingEffects._0_8_;
                        mVar13 = (mapped_type)local_60.wasm;
                        pmVar33 = std::__detail::
                                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                *)((long)local_38._M_head_impl + 0xa0),
                                               (key_type *)auStack_258);
                        *pmVar33 = mVar13;
                      }
                      uVar53 = (Index)curr + 1;
                    }
                  }
                  local_60.wasm = local_48;
                  curr = (Expression *)0x0;
                  builder.wasm = (Module *)0x0;
                  if ((undefined1  [8])
                      context.operands.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start != auStack_88) {
                    uVar19 = 0;
                    do {
                      if ((&(callFinder.infos.
                             super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->call)
                          [uVar19 % (ulong)currEffects.super_EffectAnalyzer._0_8_] == (Call *)0x0) {
LAB_009817a7:
                        std::__throw_out_of_range("_Map_base::at");
                      }
                      in_R9 = *(Module **)
                               &((&(callFinder.infos.
                                    super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->call)
                                 [uVar19 % (ulong)currEffects.super_EffectAnalyzer._0_8_]->
                                super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression;
                      uVar53 = *(uint *)&(in_R9->exports).
                                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish;
                      while ((uint)uVar19 != uVar53) {
                        in_R9 = (Module *)
                                (in_R9->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                        if ((in_R9 == (Module *)0x0) ||
                           (uVar53 = *(uint *)&(in_R9->exports).
                                               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish,
                           (ulong)uVar53 % (ulong)currEffects.super_EffectAnalyzer._0_8_ !=
                           uVar19 % (ulong)currEffects.super_EffectAnalyzer._0_8_))
                        goto LAB_009817a7;
                      }
                      IVar17 = *(Index *)((long)&(in_R9->exports).
                                                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish + 4);
                      _auStack_258 = (_Any_data)ZEXT816(0);
                      nonMovingEffects._16_8_ =
                           std::
                           _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
                           ::_M_invoke;
                      nonMovingEffects.module =
                           (Module *)
                           std::
                           _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
                           ::_M_manager;
                      TVar43.id = currEffects.super_EffectAnalyzer._0_8_;
                      pEVar34 = ExpressionManipulator::flexibleCopy
                                          (*(pointer)((long)auStack_88 + uVar19 * 8),local_48,
                                           (CustomCopier *)auStack_258);
                      if (nonMovingEffects.module != (Module *)0x0) {
                        (*(code *)nonMovingEffects.module)(auStack_258,auStack_258,3);
                      }
                      pLVar35 = Builder::makeLocalSet(&local_60,IVar17,pEVar34);
                      auStack_258 = (undefined1  [8])pLVar35;
                      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                      emplace_back<wasm::Expression*>
                                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                                 &curr,(Expression **)auStack_258);
                      uVar19 = (ulong)((uint)uVar19 + 1);
                    } while (uVar19 < (ulong)((long)context.operands.
                                                                                                        
                                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                              (long)auStack_88 >> 3));
                  }
                  _auStack_258 = (_Any_data)ZEXT816(0);
                  local_298->_M_left = (_Base_ptr)0x0;
                  local_298->_M_right = (_Base_ptr)0x0;
                  *(undefined8 *)local_298 = 0;
                  *(undefined8 *)&((_Rb_tree_header *)&local_298->_M_parent)->_M_header = 0;
                  *(_Base_ptr *)(local_298 + 1) = (_Base_ptr)0x0;
                  nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count =
                       (size_t)&callFinder.infos.
                                super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::pushTask
                            ((Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_> *)auStack_258
                             ,PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::scan,
                             (Expression **)((long)local_38._M_head_impl + 0x60));
                  while( true ) {
                    if ((nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header.
                         _M_header._0_8_ -
                         CONCAT44(nonMovingEffects.globalsWritten._M_t._M_impl._4_4_,
                                  nonMovingEffects.globalsWritten._M_t._M_impl._0_4_) >> 4) +
                        nonMovingEffects._0_8_ == 0) break;
                    if (CONCAT44(nonMovingEffects.globalsWritten._M_t._M_impl._4_4_,
                                 nonMovingEffects.globalsWritten._M_t._M_impl._0_4_) ==
                        nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header
                        ._0_8_) {
                      if (nonMovingEffects._0_8_ == 0) {
                        pcVar41 = 
                        "T &wasm::SmallVector<wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::Task, 10>::back() [T = wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::Task, N = 10]"
                        ;
                        goto LAB_009817c8;
                      }
                      pcVar44 = *(code **)(auStack_258 + nonMovingEffects._0_8_ * 0x10);
                      auStack_258 = *(undefined1 (*) [8])
                                     (&nonMovingEffects.ignoreImplicitTraps +
                                     nonMovingEffects._0_8_ * 0x10);
                      nonMovingEffects._0_8_ = nonMovingEffects._0_8_ + -1;
                    }
                    else {
                      pcVar44 = *(code **)(nonMovingEffects.globalsWritten._M_t._M_impl.
                                           super__Rb_tree_header._M_header._0_8_ + -0x10);
                      auStack_258 = *(undefined1 (*) [8])
                                     (nonMovingEffects.globalsWritten._M_t._M_impl.
                                      super__Rb_tree_header._M_header._0_8_ + -8);
                      nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                      _0_8_ = nonMovingEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header.
                              _M_header._0_8_ + -0x10;
                    }
                    if (*(long *)auStack_258 == 0) {
                      pcVar41 = 
                      "void wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::walk(Expression *&) [SubType = LocalUpdater, VisitorType = wasm::Visitor<LocalUpdater>]"
                      ;
                      goto LAB_0098179d;
                    }
                    (*pcVar44)(auStack_258);
                  }
                  if ((Module *)curr != builder.wasm) {
                    ppEVar45 = (Expression **)((long)local_38._M_head_impl + 0x60);
                    if (builder.wasm == (Module *)0x0) {
                      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                      _M_realloc_insert<wasm::Expression*const&>
                                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                                 &curr,(iterator)0x0,ppEVar45);
                      ppEVar45 = extraout_RDX;
                    }
                    else {
                      ((builder.wasm)->exports).
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)*ppEVar45;
                      builder.wasm = (Module *)
                                     &((builder.wasm)->exports).
                                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish;
                    }
                    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
                    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Type>._M_payload =
                         (_Storage<wasm::Type,_true>)ppEVar45;
                    BVar36.wasm = (Module *)
                                  Builder::
                                  makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                                            (&local_60,
                                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                              *)&curr,type);
                    *(Module **)((long)local_38._M_head_impl + 0x60) = BVar36.wasm;
                  }
                  if ((char)context.operands.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
                    ReturnUtils::removeReturns(local_38._M_head_impl,local_48);
                  }
                  pvVar8 = (void *)CONCAT44(nonMovingEffects.globalsWritten._M_t._M_impl._4_4_,
                                            nonMovingEffects.globalsWritten._M_t._M_impl._0_4_);
                  if (pvVar8 != (void *)0x0) {
                    operator_delete(pvVar8,(long)nonMovingEffects.globalsWritten._M_t._M_impl.
                                                 super__Rb_tree_header._M_header._M_parent -
                                           (long)pvVar8);
                  }
                  if (curr != (Expression *)0x0) {
                    operator_delete(curr,-(long)curr);
                  }
                  std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)&callFinder.infos.
                                    super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if (psStack_328 != (size_t *)0x0) {
                    operator_delete(psStack_328,immovable._M_h._M_bucket_count - (long)psStack_328);
                  }
                  sVar26 = Function::getNumParams(local_38._M_head_impl);
                  if (sVar26 < 0x14) {
                    if ((char)child[5].type.id == '\x01') {
                      doOpts((Monomorphize *)(child->type).id,(Function *)local_40);
                      uVar53 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                                         ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)auStack_258,
                                          (Expression *)
                                          (local_40->elementSegments).
                                          super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                      ppEVar12 = context.operands.
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                      pMVar22 = (Module *)(double)uVar53;
                      for (auVar52 = auStack_88; auVar52 != (undefined1  [8])ppEVar12;
                          auVar52 = (undefined1  [8])((long)auVar52 + 8)) {
                        local_40 = pMVar22;
                        uVar53 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                                           ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)auStack_258
                                            ,*(Expression **)auVar52);
                        pMVar22 = (Module *)((double)local_40 + (double)uVar53);
                      }
                      if (((double)pMVar22 != 0.0) || (NAN((double)pMVar22))) {
                        local_40 = pMVar22;
                        doOpts((Monomorphize *)(child->type).id,local_38._M_head_impl);
                        uVar53 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                                           ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)auStack_258
                                            ,(local_38._M_head_impl)->body);
                        if ((double)wasm::(anonymous_namespace)::MinPercentBenefit <
                            100.0 - ((double)uVar53 * 100.0) / (double)local_40) goto LAB_009815dd;
                      }
                      bVar16 = false;
                      _Var55._M_head_impl = (Function *)&_Stack_c8;
                    }
                    else {
LAB_009815dd:
                      bVar16 = true;
                      _Var55._M_head_impl = local_38._M_head_impl;
                    }
                    nonMovingEffects.ignoreImplicitTraps =
                         (bool)(undefined1)target.super_IString.str._M_len;
                    nonMovingEffects.trapsNeverHappen = (bool)target.super_IString.str._M_len._1_1_;
                    nonMovingEffects._2_6_ = target.super_IString.str._M_len._2_6_;
                    auStack_258 = (undefined1  [8])
                                  _Stack_c8._M_t.
                                  super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                  .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
                    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &nonMovingEffects.module,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               auStack_88);
                    nonMovingEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_color._0_1_ =
                         (char)context.operands.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    pmVar37 = std::
                              unordered_map<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::equal_to<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>_>
                              ::operator[]((unordered_map<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name,_std::hash<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::equal_to<std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>_>
                                            *)this_01,(key_type *)auStack_258);
                    pcVar41 = *(char **)((long)_Var55._M_head_impl + 8);
                    (pmVar37->super_IString).str._M_len = *(size_t *)_Var55._M_head_impl;
                    (pmVar37->super_IString).str._M_str = pcVar41;
                    if (nonMovingEffects.module != (Module *)0x0) {
                      operator_delete(nonMovingEffects.module,
                                      CONCAT44(nonMovingEffects.localsRead._M_t._M_impl._4_4_,
                                               nonMovingEffects.localsRead._M_t._M_impl._0_4_) -
                                      (long)nonMovingEffects.module);
                    }
                    if (bVar16) {
                      newTarget_00.super_IString.str._M_str = (char *)&pEStack_278;
                      newTarget_00.super_IString.str._M_len =
                           (size_t)((local_38._M_head_impl)->super_Importable).super_Named.name.
                                   super_IString.str._M_str;
                      updateCall((Monomorphize *)local_50._M_nxt,
                                 (CallInfo *)
                                 ((local_38._M_head_impl)->super_Importable).super_Named.name.
                                 super_IString.str._M_len,newTarget_00,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 TVar43.id,in_R9);
                      Module::addFunction(local_48,(
                                                  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                                  *)&stack0xffffffffffffffc8);
                    }
                  }
                  if (local_38._M_head_impl != (Function *)0x0) {
                    std::default_delete<wasm::Function>::operator()
                              ((default_delete<wasm::Function> *)&stack0xffffffffffffffc8,
                               local_38._M_head_impl);
                  }
                }
                else {
                  pEVar6 = *(Export **)
                            ((long)&(p_Var24->
                                    super__Hash_node_value<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>
                                    ._M_storage._M_storage + 0x38);
                  if ((tuple<wasm::Export_*,_std::default_delete<wasm::Export>_>)pEVar6 !=
                      (_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>)
                      local_358._M_t.
                      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl) {
                    newTarget.super_IString.str._M_str = (char *)&pEStack_278;
                    newTarget.super_IString.str._M_len = (size_t)pEVar6;
                    updateCall((Monomorphize *)local_50._M_nxt,
                               *(CallInfo **)
                                ((long)&(p_Var24->
                                        super__Hash_node_value<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>,_true>
                                        ).
                                        super__Hash_node_value_base<std::pair<const_std::pair<wasm::Name,_wasm::(anonymous_namespace)::CallContext>,_wasm::Name>_>
                                        ._M_storage._M_storage + 0x30),newTarget,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               TVar43.id,in_R9);
                  }
                }
LAB_0098168f:
                if (pEStack_278 != (Expression *)0x0) {
                  operator_delete(pEStack_278,
                                  (long)newOperands.
                                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)pEStack_278);
                }
                if (auStack_88 != (undefined1  [8])0x0) {
                  operator_delete((void *)auStack_88,
                                  (long)context.operands.
                                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)auStack_88);
                }
              }
            }
            pMVar22 = (Module *)(local_50._M_nxt + 2);
          } while (pMVar22 != local_368);
        }
        if (callFinder.
            super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            .currModule != (Module *)0x0) {
          operator_delete(callFinder.
                          super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                          .currModule,
                          (long)callFinder.infos.
                                super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)callFinder.
                                super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                                .
                                super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                                .currModule);
        }
        if (callFinder.
            super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
          operator_delete(callFinder.
                          super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                          .stack.fixed._M_elems[9].currp,
                          (long)callFinder.
                                super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                                .
                                super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                                .stack.flexible.
                                super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)callFinder.
                                super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                                .
                                super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                                .stack.fixed._M_elems[9].currp);
        }
        ppuVar40 = &(local_340->
                    super__Optional_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_false,_false>
                    )._M_payload.
                    super__Optional_payload<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ._M_payload._M_value.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      } while ((pointer)ppuVar40 != local_338);
    }
    if (ppuStack_e8 != (pointer *)0x0) {
      operator_delete(ppuStack_e8,
                      (long)funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppuStack_e8);
    }
  }
  std::
  _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_bool>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_bool>,_std::allocator<std::pair<wasm::Function_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_6e0);
  return;
}

Assistant:

void run(Module* module) override {
    // TODO: parallelize, see comments below

    applyArguments();

    // Find all the return-calling functions. We cannot remove their returns
    // (because turning a return call into a normal call may break the program
    // by using more stack).
    auto returnCallersMap = ReturnUtils::findReturnCallers(*module);

    // Note the list of all functions. We'll be adding more, and do not want to
    // operate on those.
    std::vector<Name> funcNames;
    ModuleUtils::iterDefinedFunctions(
      *module, [&](Function* func) { funcNames.push_back(func->name); });

    // Find the calls in each function and optimize where we can, changing them
    // to call the monomorphized targets.
    for (auto name : funcNames) {
      auto* func = module->getFunction(name);

      CallFinder callFinder;
      callFinder.walk(func->body);
      for (auto& info : callFinder.infos) {
        if (info.call->type == Type::unreachable) {
          // Ignore unreachable code.
          // TODO: return_call?
          continue;
        }

        if (info.call->target == name) {
          // Avoid recursion, which adds some complexity (as we'd be modifying
          // ourselves if we apply optimizations).
          continue;
        }

        // If the target function does a return call, then as noted earlier we
        // cannot remove its returns, so do not consider the drop as part of the
        // context in such cases (as if we reverse-inlined the drop into the
        // target then we'd be removing the returns).
        if (returnCallersMap[module->getFunction(info.call->target)]) {
          info.drop = nullptr;
        }

        processCall(info, *module);
      }
    }
  }